

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O1

void utrie_enum_63(UTrie *trie,undefined1 *enumValue,undefined1 *enumRange,void *context)

{
  uint16_t *puVar1;
  uint32_t *puVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  code *pcVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  uint32_t uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  
  if ((trie == (UTrie *)0x0) ||
     (puVar1 = trie->index, enumRange == (undefined1 *)0x0 || puVar1 == (uint16_t *)0x0)) {
    return;
  }
  pcVar10 = enumSameValue;
  if (enumValue != (undefined1 *)0x0) {
    pcVar10 = (code *)enumValue;
  }
  puVar2 = trie->data32;
  iVar4 = (*pcVar10)(context);
  uVar19 = 0;
  if (puVar2 == (uint32_t *)0x0) {
    uVar19 = trie->indexLength;
  }
  iVar6 = 0;
  uVar20 = (ulong)uVar19;
  uVar12 = 0;
  uVar11 = 0;
  iVar15 = iVar4;
  do {
    if (uVar12 == 0xd800) {
      iVar6 = 0x800;
    }
    else if (uVar12 == 0xdc00) {
      iVar6 = 0x6e0;
    }
    uVar9 = (ulong)puVar1[iVar6];
    uVar13 = uVar9 * 4;
    uVar17 = uVar11;
    iVar5 = iVar15;
    if ((uint)uVar13 != (uint)uVar20) {
      if ((uint)uVar13 == uVar19) {
        if (iVar15 != iVar4) {
          uVar20 = (ulong)uVar19;
          uVar17 = (ulong)uVar12;
          iVar5 = iVar4;
          if ((int)uVar11 < (int)uVar12) {
            cVar3 = (*(code *)enumRange)(context,uVar11,uVar12,iVar15);
            uVar20 = (ulong)uVar19;
            uVar17 = (ulong)uVar12;
            if (cVar3 == '\0') {
              return;
            }
          }
        }
      }
      else {
        lVar21 = 0;
        do {
          if (puVar2 == (uint32_t *)0x0) {
            uVar8 = (uint)puVar1[uVar9 * 4 + lVar21];
          }
          else {
            uVar8 = puVar2[uVar9 * 4 + lVar21];
          }
          iVar5 = (*pcVar10)(context,uVar8);
          if (iVar5 != iVar15) {
            uVar20 = (ulong)uVar12 + lVar21;
            if (((int)uVar11 < (int)uVar20) &&
               (cVar3 = (*(code *)enumRange)(context,uVar11,uVar20 & 0xffffffff,iVar15),
               cVar3 == '\0')) {
              return;
            }
            uVar13 = (ulong)((uint)uVar13 | -(uint)(lVar21 != 0));
            uVar11 = uVar20 & 0xffffffff;
            iVar15 = iVar5;
          }
          lVar21 = lVar21 + 1;
          uVar17 = uVar11;
          uVar20 = uVar13;
          iVar5 = iVar15;
        } while (lVar21 != 0x20);
      }
    }
    iVar15 = iVar5;
    uVar12 = uVar12 + 0x20;
    iVar6 = iVar6 + 1;
    uVar11 = uVar17;
  } while ((int)uVar12 < 0x10000);
  uVar8 = 0xd800;
  do {
    uVar11 = uVar17;
    if ((uint)puVar1[(int)uVar8 >> 5] * 4 == uVar19) {
      iVar6 = iVar15;
      if (iVar15 != iVar4) {
        uVar20 = (ulong)uVar19;
        uVar11 = (ulong)uVar12;
        iVar6 = iVar4;
        if ((int)uVar17 < (int)uVar12) {
          cVar3 = (*(code *)enumRange)(context,uVar17,uVar12,iVar15);
          uVar20 = (ulong)uVar19;
          uVar11 = (ulong)uVar12;
          if (cVar3 == '\0') {
            return;
          }
        }
      }
      uVar8 = uVar8 + 0x20;
      uVar12 = uVar12 + 0x8000;
      iVar15 = iVar6;
    }
    else {
      uVar7 = (uint)puVar1[(int)uVar8 >> 5] * 4 + (uVar8 & 0x1f);
      if (puVar2 == (uint32_t *)0x0) {
        uVar18 = (uint32_t)puVar1[uVar7];
      }
      else {
        uVar18 = puVar2[uVar7];
      }
      uVar7 = (*trie->getFoldingOffset)(uVar18);
      if ((int)uVar7 < 1) {
        iVar6 = iVar15;
        if (iVar15 != iVar4) {
          uVar20 = (ulong)uVar19;
          uVar11 = (ulong)uVar12;
          iVar6 = iVar4;
          if ((int)uVar17 < (int)uVar12) {
            cVar3 = (*(code *)enumRange)(context,uVar17,uVar12,iVar15);
            uVar20 = (ulong)uVar19;
            uVar11 = (ulong)uVar12;
            if (cVar3 == '\0') {
              return;
            }
          }
        }
        uVar12 = uVar12 + 0x400;
        iVar15 = iVar6;
      }
      else {
        uVar9 = (ulong)uVar7;
        do {
          uVar13 = (ulong)puVar1[uVar9];
          uVar14 = uVar13 * 4;
          uVar11 = uVar17;
          iVar6 = iVar15;
          if ((uint)uVar14 != (uint)uVar20) {
            if ((uint)uVar14 == uVar19) {
              if (iVar15 != iVar4) {
                uVar20 = (ulong)uVar19;
                uVar11 = (ulong)uVar12;
                iVar6 = iVar4;
                if ((int)uVar17 < (int)uVar12) {
                  cVar3 = (*(code *)enumRange)(context,uVar17,uVar12,iVar15);
                  uVar20 = (ulong)uVar19;
                  uVar11 = (ulong)uVar12;
                  if (cVar3 == '\0') {
                    return;
                  }
                }
              }
            }
            else {
              lVar21 = 0;
              do {
                if (puVar2 == (uint32_t *)0x0) {
                  uVar16 = (uint)puVar1[uVar13 * 4 + lVar21];
                }
                else {
                  uVar16 = puVar2[uVar13 * 4 + lVar21];
                }
                iVar6 = (*pcVar10)(context,uVar16);
                if (iVar6 != iVar15) {
                  uVar11 = (ulong)uVar12 + lVar21;
                  if (((int)uVar17 < (int)uVar11) &&
                     (cVar3 = (*(code *)enumRange)(context,uVar17,uVar11 & 0xffffffff,iVar15),
                     cVar3 == '\0')) {
                    return;
                  }
                  uVar14 = (ulong)((uint)uVar14 | -(uint)(lVar21 != 0));
                  uVar17 = uVar11 & 0xffffffff;
                  iVar15 = iVar6;
                }
                lVar21 = lVar21 + 1;
                uVar11 = uVar17;
                uVar20 = uVar14;
                iVar6 = iVar15;
              } while (lVar21 != 0x20);
            }
          }
          iVar15 = iVar6;
          uVar12 = uVar12 + 0x20;
          iVar6 = (int)uVar9;
          uVar9 = uVar9 + 1;
          uVar17 = uVar11;
        } while (iVar6 < (int)(uVar7 + 0x1f));
      }
      uVar8 = uVar8 + 1;
    }
    uVar17 = uVar11;
    if (0xdbff < (int)uVar8) {
      (*(code *)enumRange)(context,uVar11,uVar12,iVar15);
      return;
    }
  } while( true );
}

Assistant:

U_CAPI void U_EXPORT2
utrie_enum(const UTrie *trie,
           UTrieEnumValue *enumValue, UTrieEnumRange *enumRange, const void *context) {
    const uint32_t *data32;
    const uint16_t *idx;

    uint32_t value, prevValue, initialValue;
    UChar32 c, prev;
    int32_t l, i, j, block, prevBlock, nullBlock, offset;

    /* check arguments */
    if(trie==NULL || trie->index==NULL || enumRange==NULL) {
        return;
    }
    if(enumValue==NULL) {
        enumValue=enumSameValue;
    }

    idx=trie->index;
    data32=trie->data32;

    /* get the enumeration value that corresponds to an initial-value trie data entry */
    initialValue=enumValue(context, trie->initialValue);

    if(data32==NULL) {
        nullBlock=trie->indexLength;
    } else {
        nullBlock=0;
    }

    /* set variables for previous range */
    prevBlock=nullBlock;
    prev=0;
    prevValue=initialValue;

    /* enumerate BMP - the main loop enumerates data blocks */
    for(i=0, c=0; c<=0xffff; ++i) {
        if(c==0xd800) {
            /* skip lead surrogate code _units_, go to lead surr. code _points_ */
            i=UTRIE_BMP_INDEX_LENGTH;
        } else if(c==0xdc00) {
            /* go back to regular BMP code points */
            i=c>>UTRIE_SHIFT;
        }

        block=idx[i]<<UTRIE_INDEX_SHIFT;
        if(block==prevBlock) {
            /* the block is the same as the previous one, and filled with value */
            c+=UTRIE_DATA_BLOCK_LENGTH;
        } else if(block==nullBlock) {
            /* this is the all-initial-value block */
            if(prevValue!=initialValue) {
                if(prev<c) {
                    if(!enumRange(context, prev, c, prevValue)) {
                        return;
                    }
                }
                prevBlock=nullBlock;
                prev=c;
                prevValue=initialValue;
            }
            c+=UTRIE_DATA_BLOCK_LENGTH;
        } else {
            prevBlock=block;
            for(j=0; j<UTRIE_DATA_BLOCK_LENGTH; ++j) {
                value=enumValue(context, data32!=NULL ? data32[block+j] : idx[block+j]);
                if(value!=prevValue) {
                    if(prev<c) {
                        if(!enumRange(context, prev, c, prevValue)) {
                            return;
                        }
                    }
                    if(j>0) {
                        /* the block is not filled with all the same value */
                        prevBlock=-1;
                    }
                    prev=c;
                    prevValue=value;
                }
                ++c;
            }
        }
    }

    /* enumerate supplementary code points */
    for(l=0xd800; l<0xdc00;) {
        /* lead surrogate access */
        offset=idx[l>>UTRIE_SHIFT]<<UTRIE_INDEX_SHIFT;
        if(offset==nullBlock) {
            /* no entries for a whole block of lead surrogates */
            if(prevValue!=initialValue) {
                if(prev<c) {
                    if(!enumRange(context, prev, c, prevValue)) {
                        return;
                    }
                }
                prevBlock=nullBlock;
                prev=c;
                prevValue=initialValue;
            }

            l+=UTRIE_DATA_BLOCK_LENGTH;
            c+=UTRIE_DATA_BLOCK_LENGTH<<10;
            continue;
        }

        value= data32!=NULL ? data32[offset+(l&UTRIE_MASK)] : idx[offset+(l&UTRIE_MASK)];

        /* enumerate trail surrogates for this lead surrogate */
        offset=trie->getFoldingOffset(value);
        if(offset<=0) {
            /* no data for this lead surrogate */
            if(prevValue!=initialValue) {
                if(prev<c) {
                    if(!enumRange(context, prev, c, prevValue)) {
                        return;
                    }
                }
                prevBlock=nullBlock;
                prev=c;
                prevValue=initialValue;
            }

            /* nothing else to do for the supplementary code points for this lead surrogate */
            c+=0x400;
        } else {
            /* enumerate code points for this lead surrogate */
            i=offset;
            offset+=UTRIE_SURROGATE_BLOCK_COUNT;
            do {
                /* copy of most of the body of the BMP loop */
                block=idx[i]<<UTRIE_INDEX_SHIFT;
                if(block==prevBlock) {
                    /* the block is the same as the previous one, and filled with value */
                    c+=UTRIE_DATA_BLOCK_LENGTH;
                } else if(block==nullBlock) {
                    /* this is the all-initial-value block */
                    if(prevValue!=initialValue) {
                        if(prev<c) {
                            if(!enumRange(context, prev, c, prevValue)) {
                                return;
                            }
                        }
                        prevBlock=nullBlock;
                        prev=c;
                        prevValue=initialValue;
                    }
                    c+=UTRIE_DATA_BLOCK_LENGTH;
                } else {
                    prevBlock=block;
                    for(j=0; j<UTRIE_DATA_BLOCK_LENGTH; ++j) {
                        value=enumValue(context, data32!=NULL ? data32[block+j] : idx[block+j]);
                        if(value!=prevValue) {
                            if(prev<c) {
                                if(!enumRange(context, prev, c, prevValue)) {
                                    return;
                                }
                            }
                            if(j>0) {
                                /* the block is not filled with all the same value */
                                prevBlock=-1;
                            }
                            prev=c;
                            prevValue=value;
                        }
                        ++c;
                    }
                }
            } while(++i<offset);
        }

        ++l;
    }

    /* deliver last range */
    enumRange(context, prev, c, prevValue);
}